

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_ftp.c
# Opt level: O1

int32_t ll_ftp_init(ll_ftp_t *f,ll_ftp_callbacks_t *cb)

{
  ll_ftp_read_t p_Var1;
  ll_ftp_write_t p_Var2;
  ll_ftp_close_t p_Var3;
  ll_ftp_apply_t p_Var4;
  ll_ftp_send_uplink_t p_Var5;
  int32_t iVar6;
  
  iVar6 = 2;
  if ((((cb->open != (ll_ftp_open_t)0x0) && (cb->read != (ll_ftp_read_t)0x0)) &&
      (cb->write != (ll_ftp_write_t)0x0)) &&
     (((cb->close != (ll_ftp_close_t)0x0 && (cb->apply != (ll_ftp_apply_t)0x0)) &&
      ((cb->uplink != (ll_ftp_send_uplink_t)0x0 && (cb->config != (ll_ftp_dl_config_t)0x0)))))) {
    f->state = IDLE;
    f->num_segs = 0;
    iVar6 = 0;
    memset(f->rx_segs,0,0x5ea);
    p_Var1 = cb->read;
    p_Var2 = cb->write;
    p_Var3 = cb->close;
    p_Var4 = cb->apply;
    p_Var5 = cb->uplink;
    (f->cb).open = cb->open;
    (f->cb).read = p_Var1;
    (f->cb).write = p_Var2;
    (f->cb).close = p_Var3;
    (f->cb).apply = p_Var4;
    (f->cb).uplink = p_Var5;
    (f->cb).config = cb->config;
  }
  return iVar6;
}

Assistant:

int32_t ll_ftp_init(ll_ftp_t* f, ll_ftp_callbacks_t* cb)
{
    if((NULL == cb->open) || (NULL == cb->read) ||
       (NULL == cb->write) || (NULL == cb->close) ||
       (NULL == cb->apply) || (NULL == cb->uplink) ||
       (NULL == cb->config))
    {
        return LL_FTP_INVALID_VALUE;
    }

    ll_ftp_state_set(f, IDLE);
    f->num_segs = 0;
    memset(f->rx_segs, 0, sizeof(f->rx_segs[0]) * NUM_RX_SEGS_BITMASK);
    f->file_id = 0;
    f->file_version = 0;
    f->file_size = 0;
    f->time_last_msg.tv_sec = 0;
    f->time_last_msg.tv_nsec = 0;
    f->retry_count = 0;
    f->is_processing = false;
    memset(f->tx_buf, 0, sizeof(f->tx_buf[0]) * LL_FTP_TX_BUF_SIZE);

    f->cb = *cb;

    return LL_FTP_OK;
}